

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall QPDFWriter::closeObject(QPDFWriter *this,int objid)

{
  element_type *peVar1;
  NewObject *this_00;
  qpdf_offset_t qVar2;
  qpdf_offset_t qVar3;
  NewObject *new_obj;
  string_view local_28;
  int local_14;
  QPDFWriter *pQStack_10;
  int objid_local;
  QPDFWriter *this_local;
  
  local_14 = objid;
  pQStack_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"\nendobj\n");
  writeString(this,local_28);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&new_obj,"\n");
  writeStringQDF(this,_new_obj);
  peVar1 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  this_00 = ObjTable<QPDFWriter::NewObject>::operator[]
                      (&(peVar1->new_obj).super_ObjTable<QPDFWriter::NewObject>,local_14);
  peVar1 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  qVar2 = ::qpdf::pl::Count::getCount(peVar1->pipeline);
  qVar3 = QPDFXRefEntry::getOffset(&this_00->xref);
  this_00->length = qVar2 - qVar3;
  return;
}

Assistant:

void
QPDFWriter::closeObject(int objid)
{
    // Write a newline before endobj as it makes the file easier to repair.
    writeString("\nendobj\n");
    writeStringQDF("\n");
    auto& new_obj = m->new_obj[objid];
    new_obj.length = m->pipeline->getCount() - new_obj.xref.getOffset();
}